

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple_data_segment.cpp
# Opt level: O2

TupleDataChunk * __thiscall
duckdb::TupleDataChunk::operator=(TupleDataChunk *this,TupleDataChunk *other)

{
  SwapTupleDataChunk(this,other);
  return this;
}

Assistant:

TupleDataChunk &TupleDataChunk::operator=(TupleDataChunk &&other) noexcept {
	SwapTupleDataChunk(*this, other);
	return *this;
}